

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

work_t __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBoundsInv
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,long i,long k,int j)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((((-1 < j) && (-1 < i)) && (j < this->depth)) &&
     (((-1 < k && (i < this->width)) && (k < this->height)))) {
    uVar1 = (uint)this->img[(uint)j][k][i];
  }
  return uVar1;
}

Assistant:

work_t getBoundsInv(long i, long k, int j=0) const
    {
      work_t ret=ptraits::invalid();

      if (j >= 0 && j < depth && i >= 0 && i < width && k >= 0 && k < height)
      {
        ret=static_cast<work_t>(img[j][k][i]);
      }

      return ret;
    }